

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

void __thiscall
entityx::EntityManager::
ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>::next
          (ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>
           *this)

{
  bool bVar1;
  Id id;
  EntityManager *in_RDI;
  Entity entity;
  Entity *entity_00;
  uint7 in_stack_ffffffffffffffd0;
  byte bVar2;
  
  while( true ) {
    bVar2 = 0;
    if ((ulong)*(uint *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) {
      bVar1 = predicate((ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>
                         *)(ulong)in_stack_ffffffffffffffd0);
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) == 0) break;
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  }
  if ((ulong)*(uint *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) {
    entity_00 = *(Entity **)in_RDI;
    id = create_id((EntityManager *)entity_00,0);
    EntityManager::get(in_RDI,id);
    UnpackingView<Position,_Direction,_Tag>::Iterator::next_entity
              ((Iterator *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),entity_00);
  }
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }